

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

void __thiscall
duckdb::Serializer::WritePropertyWithDefault<duckdb::LogicalDependencyList>
          (Serializer *this,field_id_t field_id,char *tag,LogicalDependencyList *value,
          LogicalDependencyList *default_value)

{
  bool bVar1;
  undefined8 in_RDX;
  undefined2 in_SI;
  Serializer *in_RDI;
  LogicalDependencyList *in_stack_ffffffffffffffc8;
  undefined6 in_stack_fffffffffffffff0;
  
  if ((((in_RDI->options).serialize_default_values & 1U) == 0) &&
     (bVar1 = LogicalDependencyList::operator==
                        ((LogicalDependencyList *)in_RDI,
                         (LogicalDependencyList *)CONCAT26(in_SI,in_stack_fffffffffffffff0)), bVar1)
     ) {
    (*(code *)(((create_info_set_t *)&in_RDI->_vptr_Serializer)->_M_h)._M_buckets[4])
              (in_RDI,in_SI,in_RDX,0);
    (*(code *)(((create_info_set_t *)&in_RDI->_vptr_Serializer)->_M_h)._M_buckets[5])(in_RDI,0);
  }
  else {
    (*(code *)(((create_info_set_t *)&in_RDI->_vptr_Serializer)->_M_h)._M_buckets[4])
              (in_RDI,in_SI,in_RDX,1);
    WriteValue<duckdb::LogicalDependencyList>(in_RDI,in_stack_ffffffffffffffc8);
    (*in_RDI->_vptr_Serializer[5])(in_RDI,1);
  }
  return;
}

Assistant:

void WritePropertyWithDefault(const field_id_t field_id, const char *tag, const T &value, const T &default_value) {
		// If current value is default, don't write it
		if (!options.serialize_default_values && (value == default_value)) {
			OnOptionalPropertyBegin(field_id, tag, false);
			OnOptionalPropertyEnd(false);
			return;
		}
		OnOptionalPropertyBegin(field_id, tag, true);
		WriteValue(value);
		OnOptionalPropertyEnd(true);
	}